

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

void anon_unknown.dwarf_17105::loadDemodulator(Demodulator *out,Value *v)

{
  bool bVar1;
  return_type rVar2;
  return_type pbVar3;
  string *in_RDI;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  *table;
  Value *in_stack_00000068;
  string *in_stack_00000160;
  StatsPublisher *in_stack_ffffffffffffff98;
  StatsPublisher *in_stack_ffffffffffffffa0;
  _Self local_30;
  _Self local_28;
  return_type local_20;
  return_type local_18;
  string *local_8;
  
  local_8 = in_RDI;
  local_20 = toml::Value::
             as<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                       ((Value *)in_stack_ffffffffffffffa0);
  local_18 = local_20;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
                *)in_stack_ffffffffffffff98);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                 *)0x17af07);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    if (bVar1) {
      pbVar3 = toml::Value::as<std::__cxx11::string>((Value *)in_stack_ffffffffffffffa0);
      std::__cxx11::string::operator=(local_8,(string *)pbVar3);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
      if (bVar1) {
        pbVar3 = toml::Value::as<std::__cxx11::string>((Value *)in_stack_ffffffffffffffa0);
        std::__cxx11::string::operator=(local_8 + 0x20,(string *)pbVar3);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
        if (bVar1) {
          createStatsPublisher(in_stack_00000068);
          Config::StatsPublisher::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          Config::StatsPublisher::~StatsPublisher((StatsPublisher *)0x17afc8);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
          if (bVar1) {
            rVar2 = toml::Value::as<int>((Value *)in_stack_ffffffffffffffa0);
            *(return_type *)(local_8 + 0x60) = rVar2;
          }
          else {
            throwInvalidKey(in_stack_00000160);
          }
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>
                  *)in_stack_ffffffffffffffa0);
  }
  return;
}

Assistant:

void loadDemodulator(Config::Demodulator& out, const toml::Value& v) {
  const auto& table = v.as<toml::Table>();
  for (const auto& it : table) {
    const auto& key = it.first;
    const auto& value = it.second;

    if (key == "mode") {
      out.downlinkType = value.as<std::string>();
      continue;
    }

    if (key == "source") {
      out.source = value.as<std::string>();
      continue;
    }

    if (key == "stats_publisher") {
      out.statsPublisher = createStatsPublisher(value);
      continue;
    }

    if (key == "decimation") {
      out.decimation = value.as<int>();
      continue;
    }

    throwInvalidKey(key);
  }
}